

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O0

Int64FeatureType * __thiscall
CoreML::Specification::DictionaryFeatureType::mutable_int64keytype(DictionaryFeatureType *this)

{
  Int64FeatureType *pIVar1;
  Int64FeatureType *_msg;
  DictionaryFeatureType *this_local;
  
  pIVar1 = _internal_mutable_int64keytype(this);
  return pIVar1;
}

Assistant:

inline ::CoreML::Specification::Int64FeatureType* DictionaryFeatureType::mutable_int64keytype() {
  ::CoreML::Specification::Int64FeatureType* _msg = _internal_mutable_int64keytype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.DictionaryFeatureType.int64KeyType)
  return _msg;
}